

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  bool bVar1;
  uint uVar2;
  xpath_value_type xVar3;
  xpath_variable *pxVar4;
  ulong uVar5;
  xpath_value_type in_EDX;
  char_t *in_RSI;
  long in_RDI;
  xpath_variable *result;
  xpath_variable *var;
  size_t hash;
  size_t hash_size;
  char_t *in_stack_ffffffffffffffa8;
  char_t *in_stack_ffffffffffffffb0;
  xpath_variable *local_38;
  
  uVar2 = impl::anon_unknown_0::hash_string(in_RSI);
  uVar5 = (ulong)uVar2 & 0x3f;
  local_38 = *(xpath_variable **)(in_RDI + uVar5 * 8);
  while( true ) {
    if (local_38 == (xpath_variable *)0x0) {
      pxVar4 = impl::anon_unknown_0::new_xpath_variable
                         ((xpath_value_type)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb0);
      if (pxVar4 != (xpath_variable *)0x0) {
        pxVar4->_next = *(xpath_variable **)(in_RDI + uVar5 * 8);
        *(xpath_variable **)(in_RDI + uVar5 * 8) = pxVar4;
      }
      return pxVar4;
    }
    xpath_variable::name(local_38);
    bVar1 = impl::anon_unknown_0::strequal(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) break;
    local_38 = local_38->_next;
  }
  xVar3 = xpath_variable::type(local_38);
  if (xVar3 == in_EDX) {
    return local_38;
  }
  return (xpath_variable *)0x0;
}

Assistant:

PUGI_IMPL_FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : NULL;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}